

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

bool NscPushDefaultValue(CNscPStackEntry *pOut,NscType nType)

{
  bool bVar1;
  CNscPStackEntry *this;
  float in_ESI;
  CNscPStackEntry *in_RDI;
  CNscPStackEntry *unaff_retaddr;
  NscType in_stack_ffffffffffffffdc;
  float z;
  float in_stack_fffffffffffffff8;
  float in_stack_fffffffffffffffc;
  
  this = (CNscPStackEntry *)(ulong)((int)in_ESI - 6);
  z = (float)((ulong)in_RDI >> 0x20);
  switch(this) {
  case (CNscPStackEntry *)0x0:
    CNscPStackEntry::PushConstantInteger(in_RDI,(int)in_ESI);
    CNscPStackEntry::SetType(this,in_stack_ffffffffffffffdc);
    bVar1 = true;
    break;
  case (CNscPStackEntry *)0x1:
    CNscPStackEntry::PushConstantFloat(in_RDI,in_ESI);
    CNscPStackEntry::SetType(this,in_stack_ffffffffffffffdc);
    bVar1 = true;
    break;
  case (CNscPStackEntry *)0x2:
    CNscPStackEntry::PushConstantString
              (unaff_retaddr,(char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (int)z);
    CNscPStackEntry::SetType(this,in_stack_ffffffffffffffdc);
    bVar1 = true;
    break;
  case (CNscPStackEntry *)0x3:
    CNscPStackEntry::PushConstantObject(in_RDI,(UINT32)in_ESI);
    CNscPStackEntry::SetType(this,in_stack_ffffffffffffffdc);
    bVar1 = true;
    break;
  case (CNscPStackEntry *)0x4:
    CNscPStackEntry::PushConstantVector
              (unaff_retaddr,in_stack_fffffffffffffffc,in_stack_fffffffffffffff8,z);
    CNscPStackEntry::SetType(this,in_stack_ffffffffffffffdc);
    bVar1 = true;
    break;
  default:
    bVar1 = CNscContext::IsStructure(g_pCtx,(NscType)in_ESI);
    if (bVar1) {
      CNscPStackEntry::PushConstantStructure(in_RDI,(NscType)in_ESI);
      CNscPStackEntry::SetType(this,in_stack_ffffffffffffffdc);
      bVar1 = true;
    }
    else {
      CNscPStackEntry::SetType(this,in_stack_ffffffffffffffdc);
      bVar1 = false;
    }
    break;
  case (CNscPStackEntry *)0xc:
    CNscPStackEntry::PushConstantLocation(in_RDI,(int)in_ESI);
    CNscPStackEntry::SetType(this,in_stack_ffffffffffffffdc);
    bVar1 = true;
    break;
  case (CNscPStackEntry *)0x11:
    CNscPStackEntry::PushConstantJson
              (unaff_retaddr,(char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (int)z);
    CNscPStackEntry::SetType(this,in_stack_ffffffffffffffdc);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool NscPushDefaultValue (CNscPStackEntry *pOut, NscType nType)
{
	switch (nType)
	{

		case NscType_Integer:
			pOut ->PushConstantInteger (0);
			pOut ->SetType (NscType_Integer);
			return true;

		case NscType_Float:
			pOut ->PushConstantFloat (0.0f);
			pOut ->SetType (NscType_Float);
			return true;

		case NscType_String:
			pOut ->PushConstantString ("", 0);
			pOut ->SetType (NscType_String);
			return true;

		case NscType_Engine_2:
			pOut ->PushConstantLocation(LOCATION_PRESET_INVALID);
			pOut ->SetType (NscType_Engine_2);
			return true;

		case NscType_Engine_7:
			pOut ->PushConstantJson ("");
			pOut ->SetType (NscType_Engine_7);
			return true;

		case NscType_Object:
			pOut ->PushConstantObject (1); // OBJECT_INVALID
			pOut ->SetType (NscType_Object);
			return true;

		case NscType_Vector:
			pOut ->PushConstantVector (0.0f, 0.0f, 0.0f);
			pOut ->SetType (NscType_Vector);
			return true;

		default:

			//
			// If this is a structure type
			//

			if (g_pCtx ->IsStructure (nType))
			{
				pOut ->PushConstantStructure (nType);
				pOut ->SetType (nType);
				return true;
			}

			pOut ->SetType (NscType_Error);
			return false;

	}
}